

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrfork.c
# Opt level: O3

FT_Error raccess_guess_darwin_hfsplus
                   (FT_Library library,FT_Stream stream,char *base_file_name,char **result_file_name
                   ,FT_Long *result_offset)

{
  size_t __n;
  FT_Error FVar1;
  size_t __n_00;
  char *__s;
  
  __n_00 = strlen(base_file_name);
  FVar1 = 10;
  if ((long)__n_00 < 0x7ffffffa) {
    __n = __n_00 + 6;
    if ((long)__n_00 < -5) {
      if (__n != 0) {
        return 6;
      }
      __s = (char *)0x0;
    }
    else {
      __s = (char *)(*library->memory->alloc)(library->memory,__n);
      if (__s == (char *)0x0) {
        return 0x40;
      }
      memset(__s,0,__n);
    }
    memcpy(__s,base_file_name,__n_00);
    builtin_strncpy(__s + __n_00,"/rsrc",6);
    *result_file_name = __s;
    *result_offset = 0;
    FVar1 = 0;
  }
  return FVar1;
}

Assistant:

static FT_Error
  raccess_guess_darwin_hfsplus( FT_Library  library,
                                FT_Stream   stream,
                                char       *base_file_name,
                                char      **result_file_name,
                                FT_Long    *result_offset )
  {
    /*
      Only meaningful on systems with hfs+ drivers (or Macs).
     */
    FT_Error   error;
    char*      newpath = NULL;
    FT_Memory  memory;
    FT_Long    base_file_len = (FT_Long)ft_strlen( base_file_name );

    FT_UNUSED( stream );


    memory = library->memory;

    if ( base_file_len + 6 > FT_INT_MAX )
      return FT_THROW( Array_Too_Large );

    if ( FT_ALLOC( newpath, base_file_len + 6 ) )
      return error;

    FT_MEM_COPY( newpath, base_file_name, base_file_len );
    FT_MEM_COPY( newpath + base_file_len, "/rsrc", 6 );

    *result_file_name = newpath;
    *result_offset    = 0;

    return FT_Err_Ok;
  }